

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.cpp
# Opt level: O3

vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *
CRange::init_target(vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *__return_storage_ptr__,
                   char *targetfile)

{
  undefined1 local_40 [8];
  string targetstring;
  
  std::__cxx11::string::string
            ((string *)local_40,targetfile,(allocator *)(targetstring.field_2._M_local_buf + 0xf));
  init_target(__return_storage_ptr__,(string *)local_40);
  if (local_40 != (undefined1  [8])&targetstring._M_string_length) {
    operator_delete((void *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CRange::Tdata> CRange::init_target( const char *targetfile )
{
    const std::string targetstring = targetfile;
    return CRange::init_target(targetstring);
}